

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResolvingDecoder.cc
# Opt level: O1

double __thiscall
avro::parsing::
ResolvingDecoderImpl<avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>_>::
decodeDouble(ResolvingDecoderImpl<avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>_>
             *this)

{
  _func_int **pp_Var1;
  Kind KVar2;
  int iVar3;
  undefined4 extraout_var;
  float extraout_XMM0_Da;
  double dVar4;
  double extraout_XMM0_Qa;
  
  KVar2 = SimpleParser<avro::parsing::ResolvingDecoderHandler>::advance(&this->parser_,sDouble);
  pp_Var1 = ((this->base_).px)->_vptr_Decoder;
  if (KVar2 == sFloat) {
    (*pp_Var1[7])();
    dVar4 = (double)extraout_XMM0_Da;
  }
  else if (KVar2 == sLong) {
    iVar3 = (*pp_Var1[6])();
    dVar4 = (double)CONCAT44(extraout_var,iVar3);
  }
  else {
    if (KVar2 != sInt) {
      (*pp_Var1[8])();
      return extraout_XMM0_Qa;
    }
    iVar3 = (*pp_Var1[5])();
    dVar4 = (double)iVar3;
  }
  return dVar4;
}

Assistant:

double ResolvingDecoderImpl<P>::decodeDouble()
{
    Symbol::Kind k = parser_.advance(Symbol::sDouble);
    return k == Symbol::sInt ? base_->decodeInt() :
        k == Symbol::sLong ? base_->decodeLong() :
        k == Symbol::sFloat ? base_->decodeFloat() :
        base_->decodeDouble();
}